

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O1

void select_button(Token *button)

{
  Sprite *pSVar1;
  float end_val;
  uint uVar2;
  Token *pTVar3;
  Interp func;
  float *lval;
  
  pTVar3 = selected_button;
  if (selected_button != button) {
    if (selected_button != (Token *)0x0) {
      pSVar1 = &selected_button->top;
      anim_full(pSVar1,&(selected_button->top).scale_x,(selected_button->top).scale_x,0.8,
                INTERP_SLOW,0.0,0.3);
      anim_full(pSVar1,&(pTVar3->top).scale_y,(pTVar3->top).scale_y,0.8,INTERP_SLOW,0.0,0.3);
      anim_full(pSVar1,&(pTVar3->top).opacity,(pTVar3->top).opacity,0.5,INTERP_DOUBLE_SLOW,0.0,0.2);
      pTVar3 = selected_button;
      pSVar1 = &selected_button->bot;
      anim_full(pSVar1,&(selected_button->bot).scale_x,(selected_button->bot).scale_x,0.6,
                INTERP_SLOW,0.0,0.3);
      anim_full(pSVar1,&(pTVar3->bot).scale_y,(pTVar3->bot).scale_y,0.6,INTERP_SLOW,0.0,0.3);
    }
    pSVar1 = &button->top;
    selected_button = button;
    anim_full(pSVar1,&(button->top).scale_x,(button->top).scale_x,1.1,INTERP_FAST,0.0,0.3);
    anim_full(pSVar1,&(button->top).scale_y,(button->top).scale_y,1.1,INTERP_FAST,0.0,0.3);
    anim_full(pSVar1,&(button->top).opacity,(button->top).opacity,1.0,INTERP_FAST,0.0,0.3);
    anim_full(&button->bot,&(button->bot).scale_x,(button->bot).scale_x,0.9,INTERP_FAST,0.0,0.3);
    lval = &(button->bot).scale_y;
    anim_full(&button->bot,lval,(button->bot).scale_y,0.9,INTERP_FAST,0.0,0.3);
    uVar2 = button->type;
    end_val = button->x;
    anim_tint(&glow,glow_color[(int)uVar2],(Interp)lval,3.0);
    func = 0x11f704;
    anim_full(&glow,&glow.x,glow.x,end_val,INTERP_SLOW_IN_OUT,0.0,3.0);
    anim_tint(&glow_overlay,glow_color[(int)uVar2],func,4.0);
    anim_full(&glow_overlay,&glow_overlay.opacity,glow_overlay.opacity,1.0,INTERP_SLOW_IN_OUT,0.0,
              4.0);
    al_play_sample(0x3f800000,0,0x3f800000,select_sample,0x100,0);
    return;
  }
  return;
}

Assistant:

static void select_button(Token *button)
{
   Sprite *spr;

   if (button == selected_button)
      return;

   if (selected_button) {
      spr = &selected_button->top;
      anim_to(spr, &spr->scale_x, button_unsel_scale, INTERP_SLOW, 0.3);
      anim_to(spr, &spr->scale_y, button_unsel_scale, INTERP_SLOW, 0.3);
      anim_to(spr, &spr->opacity, 0.5, INTERP_DOUBLE_SLOW, 0.2);

      spr = &selected_button->bot;
      anim_to(spr, &spr->scale_x, dropshadow_unsel_scale, INTERP_SLOW, 0.3);
      anim_to(spr, &spr->scale_y, dropshadow_unsel_scale, INTERP_SLOW, 0.3);
   }

   selected_button = button;

   spr = &button->top;
   anim_to(spr, &spr->scale_x, button_sel_scale, INTERP_FAST, 0.3);
   anim_to(spr, &spr->scale_y, button_sel_scale, INTERP_FAST, 0.3);
   anim_to(spr, &spr->opacity, 1.0, INTERP_FAST, 0.3);

   spr = &button->bot;
   anim_to(spr, &spr->scale_x, dropshadow_sel_scale, INTERP_FAST, 0.3);
   anim_to(spr, &spr->scale_y, dropshadow_sel_scale, INTERP_FAST, 0.3);

   change_healthy_glow(button->type, button->x);

   al_play_sample(select_sample, 1.0, 0.0, 1.0, ALLEGRO_PLAYMODE_ONCE, NULL);
}